

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

bool operator==(Vehicle *a,Vehicle *b)

{
  Person *a_00;
  Person *b_00;
  __type _Var1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((a->type == b->type) && (a->_age == b->_age)) {
    std::__cxx11::string::string((string *)&local_50,(string *)&a->_name);
    std::__cxx11::string::string((string *)&local_30,(string *)&b->_name);
    _Var1 = std::operator==(&local_50,&local_30);
    if (_Var1) {
      a_00 = (a->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
             super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
             super__Head_base<0UL,_Person_*,_false>._M_head_impl;
      b_00 = (b->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
             super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
             super__Head_base<0UL,_Person_*,_false>._M_head_impl;
      if (b_00 == (Person *)0x0 || a_00 == (Person *)0x0) {
        bVar2 = a_00 == (Person *)0x0 && b_00 == (Person *)0x0;
      }
      else {
        bVar2 = operator==(a_00,b_00);
      }
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const Vehicle& a, const Vehicle& b)
  {
    return a.type == b.type
      &&   a.age() == b.age()
      &&   a.name() == b.name()
      &&   pointee_equal(a.owner().get(), b.owner().get());
  }